

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CThreadSynchronizationInfo::CThreadSynchronizationInfo(CThreadSynchronizationInfo *this)

{
  int local_18 [2];
  CThreadSynchronizationInfo *local_10;
  CThreadSynchronizationInfo *this_local;
  
  local_10 = this;
  CThreadInfoInitializer::CThreadInfoInitializer(&this->super_CThreadInfoInitializer);
  (this->super_CThreadInfoInitializer)._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_01dc4278;
  this->m_tsThreadState = TS_IDLE;
  this->m_shridWaitAwakened = 0;
  local_18[1] = 0;
  Volatile<int>::Volatile(&this->m_lLocalSynchLockCount,local_18 + 1);
  local_18[0] = 0;
  Volatile<int>::Volatile(&this->m_lSharedSynchLockCount,local_18);
  _ThreadNativeWaitData::_ThreadNativeWaitData(&this->m_tnwdNativeData);
  _ThreadWaitInfo::_ThreadWaitInfo(&this->m_twiWaitInfo);
  (this->m_leOwnedObjsList).Blink = &this->m_leOwnedObjsList;
  (this->m_leOwnedObjsList).Flink = &this->m_leOwnedObjsList;
  this->m_lPendingSignalingCount = 0;
  (this->m_lePendingSignalingsOverflowList).Blink = &this->m_lePendingSignalingsOverflowList;
  (this->m_lePendingSignalingsOverflowList).Flink = &this->m_lePendingSignalingsOverflowList;
  return;
}

Assistant:

CThreadSynchronizationInfo::CThreadSynchronizationInfo() :
            m_tsThreadState(TS_IDLE),
            m_shridWaitAwakened(NULLSharedID),
            m_lLocalSynchLockCount(0),
            m_lSharedSynchLockCount(0)
    {
        InitializeListHead(&m_leOwnedObjsList);

#ifdef SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        m_lPendingSignalingCount = 0;
        InitializeListHead(&m_lePendingSignalingsOverflowList);
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
    }